

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

__ssize_t __thiscall
httplib::detail::stream_line_reader::getline
          (stream_line_reader *this,char **__lineptr,size_t *__n,FILE *__stream)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  int n;
  char byte;
  size_t i;
  undefined4 in_stack_ffffffffffffffe4;
  long local_18;
  undefined1 local_1;
  ulong uVar3;
  
  this->fixed_buffer_used_size_ = 0;
  std::__cxx11::string::clear();
  local_18 = 0;
  do {
    iVar1 = (*this->strm_->_vptr_Stream[2])(this->strm_,&stack0xffffffffffffffe7,1);
    uVar3 = CONCAT44(extraout_var,iVar1);
    if (iVar1 < 0) {
      local_1 = 0;
LAB_001c8550:
      return CONCAT71((int7)(uVar3 >> 8),local_1);
    }
    if (iVar1 == 0) {
      if (local_18 == 0) {
        local_1 = 0;
      }
      else {
LAB_001c854b:
        local_1 = 1;
      }
      goto LAB_001c8550;
    }
    append((stream_line_reader *)CONCAT44(in_stack_ffffffffffffffe4,iVar1),
           (char)((ulong)this >> 0x38));
    uVar2 = (uint)(char)((uint)in_stack_ffffffffffffffe4 >> 0x18);
    uVar3 = (ulong)uVar2;
    if (uVar2 == 10) goto LAB_001c854b;
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

bool getline() {
    fixed_buffer_used_size_ = 0;
    glowable_buffer_.clear();

    for (size_t i = 0;; i++) {
      char byte;
      auto n = strm_.read(&byte, 1);

      if (n < 0) {
        return false;
      } else if (n == 0) {
        if (i == 0) {
          return false;
        } else {
          break;
        }
      }

      append(byte);

      if (byte == '\n') { break; }
    }

    return true;
  }